

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O3

visplane_t * R_CheckPlane(visplane_t *pl,int start,int stop)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  visplane_t *pvVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  short *psVar12;
  int iVar14;
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  int iVar35;
  int iVar38;
  undefined1 auVar36 [16];
  int iVar39;
  undefined1 auVar37 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar42 [16];
  long lVar17;
  
  if ((start < 0) || (viewwidth <= start)) {
    __assert_fail("start >= 0 && start < viewwidth",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_plane.cpp"
                  ,0x2d8,"visplane_t *R_CheckPlane(visplane_t *, int, int)");
  }
  if ((start < stop) && (stop <= viewwidth)) {
    uVar11 = pl->left;
    iVar35 = pl->right;
    uVar9 = start;
    if (start < (int)uVar11) {
      uVar9 = uVar11;
    }
    if (start <= (int)uVar11) {
      uVar11 = start;
    }
    iVar14 = stop;
    if (iVar35 < stop) {
      iVar14 = iVar35;
    }
    if (iVar35 <= stop) {
      iVar35 = stop;
    }
    if ((int)uVar9 < iVar14) {
      psVar12 = (short *)(&pl->field_0xda + (ulong)uVar9 * 2);
      do {
        if (*psVar12 != 0x7fff) {
          if (((pl->portal == (FSectorPortal *)0x0) || ((pl->portal->mFlags & 2) != 0)) ||
             (uVar11 = 0x80, !viewactive)) {
            uVar11 = SUB84((pl->height).D + 103079215104.0,0) * 7 +
                     (pl->picnum).texnum * 3 + pl->lightlevel & 0x7f;
          }
          pvVar7 = new_visplane(uVar11);
          (pvVar7->height).normal.Z = (pl->height).normal.Z;
          dVar3 = (pl->height).normal.Y;
          (pvVar7->height).normal.X = (pl->height).normal.X;
          (pvVar7->height).normal.Y = dVar3;
          dVar3 = (pl->height).negiC;
          (pvVar7->height).D = (pl->height).D;
          (pvVar7->height).negiC = dVar3;
          (pvVar7->picnum).texnum = (pl->picnum).texnum;
          pvVar7->lightlevel = pl->lightlevel;
          (pvVar7->xform).yScale = (pl->xform).yScale;
          dVar3 = (pl->xform).xOffs;
          dVar4 = (pl->xform).yOffs;
          dVar5 = (pl->xform).xScale;
          (pvVar7->xform).baseyOffs = (pl->xform).baseyOffs;
          (pvVar7->xform).xScale = dVar5;
          (pvVar7->xform).xOffs = dVar3;
          (pvVar7->xform).yOffs = dVar4;
          (pvVar7->xform).Angle.Degrees = (pl->xform).Angle.Degrees;
          (pvVar7->xform).baseAngle.Degrees = (pl->xform).baseAngle.Degrees;
          pvVar7->colormap = pl->colormap;
          pvVar7->portal = pl->portal;
          pvVar7->extralight = pl->extralight;
          pvVar7->visibility = pl->visibility;
          (pvVar7->viewpos).Z = (pl->viewpos).Z;
          dVar3 = (pl->viewpos).Y;
          (pvVar7->viewpos).X = (pl->viewpos).X;
          (pvVar7->viewpos).Y = dVar3;
          (pvVar7->viewangle).Degrees = (pl->viewangle).Degrees;
          pvVar7->sky = pl->sky;
          pvVar7->Alpha = pl->Alpha;
          pvVar7->Additive = pl->Additive;
          pvVar7->CurrentPortalUniq = pl->CurrentPortalUniq;
          pvVar7->MirrorFlags = pl->MirrorFlags;
          pvVar7->CurrentSkybox = pl->CurrentSkybox;
          pvVar7->left = start;
          pvVar7->right = stop;
          auVar6 = _DAT_0073b300;
          uVar8 = (ulong)(uint)viewwidth;
          if (uVar8 == 0) {
            return pvVar7;
          }
          lVar17 = uVar8 - 1;
          auVar13._8_4_ = (int)lVar17;
          auVar13._0_8_ = lVar17;
          auVar13._12_4_ = (int)((ulong)lVar17 >> 0x20);
          uVar10 = 0;
          auVar13 = auVar13 ^ _DAT_0073b300;
          auVar16 = _DAT_0073c180;
          auVar18 = _DAT_0073c190;
          auVar19 = _DAT_0073c1a0;
          auVar20 = _DAT_0073b2f0;
          do {
            auVar21 = auVar20 ^ auVar6;
            iVar35 = auVar13._0_4_;
            iVar34 = -(uint)(iVar35 < auVar21._0_4_);
            iVar14 = auVar13._4_4_;
            auVar22._4_4_ = -(uint)(iVar14 < auVar21._4_4_);
            iVar39 = auVar13._8_4_;
            iVar38 = -(uint)(iVar39 < auVar21._8_4_);
            iVar15 = auVar13._12_4_;
            auVar22._12_4_ = -(uint)(iVar15 < auVar21._12_4_);
            auVar31._4_4_ = iVar34;
            auVar31._0_4_ = iVar34;
            auVar31._8_4_ = iVar38;
            auVar31._12_4_ = iVar38;
            auVar40 = pshuflw(in_XMM11,auVar31,0xe8);
            auVar24._4_4_ = -(uint)(auVar21._4_4_ == iVar14);
            auVar24._12_4_ = -(uint)(auVar21._12_4_ == iVar15);
            auVar24._0_4_ = auVar24._4_4_;
            auVar24._8_4_ = auVar24._12_4_;
            auVar42 = pshuflw(in_XMM12,auVar24,0xe8);
            auVar22._0_4_ = auVar22._4_4_;
            auVar22._8_4_ = auVar22._12_4_;
            auVar41 = pshuflw(auVar40,auVar22,0xe8);
            auVar21._8_4_ = 0xffffffff;
            auVar21._0_8_ = 0xffffffffffffffff;
            auVar21._12_4_ = 0xffffffff;
            auVar21 = (auVar41 | auVar42 & auVar40) ^ auVar21;
            auVar21 = packssdw(auVar21,auVar21);
            if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(&pvVar7->field_0xda + uVar10) = 0x7fff;
            }
            auVar22 = auVar24 & auVar31 | auVar22;
            auVar21 = packssdw(auVar22,auVar22);
            auVar41._8_4_ = 0xffffffff;
            auVar41._0_8_ = 0xffffffffffffffff;
            auVar41._12_4_ = 0xffffffff;
            auVar21 = packssdw(auVar21 ^ auVar41,auVar21 ^ auVar41);
            if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)(&pvVar7->field_0xdc + uVar10) = 0x7fff;
            }
            auVar21 = auVar19 ^ auVar6;
            iVar34 = -(uint)(iVar35 < auVar21._0_4_);
            auVar36._4_4_ = -(uint)(iVar14 < auVar21._4_4_);
            iVar38 = -(uint)(iVar39 < auVar21._8_4_);
            auVar36._12_4_ = -(uint)(iVar15 < auVar21._12_4_);
            auVar23._4_4_ = iVar34;
            auVar23._0_4_ = iVar34;
            auVar23._8_4_ = iVar38;
            auVar23._12_4_ = iVar38;
            auVar30._4_4_ = -(uint)(auVar21._4_4_ == iVar14);
            auVar30._12_4_ = -(uint)(auVar21._12_4_ == iVar15);
            auVar30._0_4_ = auVar30._4_4_;
            auVar30._8_4_ = auVar30._12_4_;
            auVar36._0_4_ = auVar36._4_4_;
            auVar36._8_4_ = auVar36._12_4_;
            auVar21 = auVar30 & auVar23 | auVar36;
            auVar21 = packssdw(auVar21,auVar21);
            auVar1._8_4_ = 0xffffffff;
            auVar1._0_8_ = 0xffffffffffffffff;
            auVar1._12_4_ = 0xffffffff;
            auVar21 = packssdw(auVar21 ^ auVar1,auVar21 ^ auVar1);
            if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(&pvVar7->field_0xde + uVar10) = 0x7fff;
            }
            auVar24 = pshufhw(auVar23,auVar23,0x84);
            auVar31 = pshufhw(auVar30,auVar30,0x84);
            auVar22 = pshufhw(auVar24,auVar36,0x84);
            auVar25._8_4_ = 0xffffffff;
            auVar25._0_8_ = 0xffffffffffffffff;
            auVar25._12_4_ = 0xffffffff;
            auVar25 = (auVar22 | auVar31 & auVar24) ^ auVar25;
            auVar24 = packssdw(auVar25,auVar25);
            if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pvVar7[1].next + uVar10) = 0x7fff;
            }
            auVar24 = auVar18 ^ auVar6;
            iVar34 = -(uint)(iVar35 < auVar24._0_4_);
            auVar27._4_4_ = -(uint)(iVar14 < auVar24._4_4_);
            iVar38 = -(uint)(iVar39 < auVar24._8_4_);
            auVar27._12_4_ = -(uint)(iVar15 < auVar24._12_4_);
            auVar32._4_4_ = iVar34;
            auVar32._0_4_ = iVar34;
            auVar32._8_4_ = iVar38;
            auVar32._12_4_ = iVar38;
            auVar21 = pshuflw(auVar21,auVar32,0xe8);
            auVar26._4_4_ = -(uint)(auVar24._4_4_ == iVar14);
            auVar26._12_4_ = -(uint)(auVar24._12_4_ == iVar15);
            auVar26._0_4_ = auVar26._4_4_;
            auVar26._8_4_ = auVar26._12_4_;
            in_XMM12 = pshuflw(auVar42 & auVar40,auVar26,0xe8);
            in_XMM12 = in_XMM12 & auVar21;
            auVar27._0_4_ = auVar27._4_4_;
            auVar27._8_4_ = auVar27._12_4_;
            auVar21 = pshuflw(auVar21,auVar27,0xe8);
            auVar40._8_4_ = 0xffffffff;
            auVar40._0_8_ = 0xffffffffffffffff;
            auVar40._12_4_ = 0xffffffff;
            auVar40 = (auVar21 | in_XMM12) ^ auVar40;
            auVar21 = packssdw(auVar40,auVar40);
            if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pvVar7[1].next + uVar10 + 2) = 0x7fff;
            }
            auVar27 = auVar26 & auVar32 | auVar27;
            auVar21 = packssdw(auVar27,auVar27);
            auVar42._8_4_ = 0xffffffff;
            auVar42._0_8_ = 0xffffffffffffffff;
            auVar42._12_4_ = 0xffffffff;
            auVar21 = packssdw(auVar21 ^ auVar42,auVar21 ^ auVar42);
            if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pvVar7[1].next + uVar10 + 4) = 0x7fff;
            }
            auVar21 = auVar16 ^ auVar6;
            iVar35 = -(uint)(iVar35 < auVar21._0_4_);
            auVar37._4_4_ = -(uint)(iVar14 < auVar21._4_4_);
            iVar39 = -(uint)(iVar39 < auVar21._8_4_);
            auVar37._12_4_ = -(uint)(iVar15 < auVar21._12_4_);
            auVar28._4_4_ = iVar35;
            auVar28._0_4_ = iVar35;
            auVar28._8_4_ = iVar39;
            auVar28._12_4_ = iVar39;
            auVar33._4_4_ = -(uint)(auVar21._4_4_ == iVar14);
            auVar33._12_4_ = -(uint)(auVar21._12_4_ == iVar15);
            auVar33._0_4_ = auVar33._4_4_;
            auVar33._8_4_ = auVar33._12_4_;
            auVar37._0_4_ = auVar37._4_4_;
            auVar37._8_4_ = auVar37._12_4_;
            auVar21 = auVar33 & auVar28 | auVar37;
            auVar21 = packssdw(auVar21,auVar21);
            auVar2._8_4_ = 0xffffffff;
            auVar2._0_8_ = 0xffffffffffffffff;
            auVar2._12_4_ = 0xffffffff;
            in_XMM11 = packssdw(auVar21 ^ auVar2,auVar21 ^ auVar2);
            if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pvVar7[1].next + uVar10 + 6) = 0x7fff;
            }
            auVar21 = pshufhw(auVar28,auVar28,0x84);
            auVar22 = pshufhw(auVar33,auVar33,0x84);
            auVar24 = pshufhw(auVar21,auVar37,0x84);
            auVar29._8_4_ = 0xffffffff;
            auVar29._0_8_ = 0xffffffffffffffff;
            auVar29._12_4_ = 0xffffffff;
            auVar29 = (auVar24 | auVar22 & auVar21) ^ auVar29;
            auVar21 = packssdw(auVar29,auVar29);
            if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)&pvVar7[1].colormap + uVar10) = 0x7fff;
            }
            lVar17 = auVar20._8_8_;
            auVar20._0_8_ = auVar20._0_8_ + 8;
            auVar20._8_8_ = lVar17 + 8;
            lVar17 = auVar19._8_8_;
            auVar19._0_8_ = auVar19._0_8_ + 8;
            auVar19._8_8_ = lVar17 + 8;
            lVar17 = auVar18._8_8_;
            auVar18._0_8_ = auVar18._0_8_ + 8;
            auVar18._8_8_ = lVar17 + 8;
            lVar17 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 8;
            auVar16._8_8_ = lVar17 + 8;
            uVar10 = uVar10 + 0x10;
          } while ((uVar8 * 2 + 0xe & 0xfffffffffffffff0) != uVar10);
          return pvVar7;
        }
        psVar12 = psVar12 + 1;
        uVar9 = uVar9 + 1;
      } while ((int)uVar9 < iVar14);
    }
    pl->left = uVar11;
    pl->right = iVar35;
    return pl;
  }
  __assert_fail("stop > start && stop <= viewwidth",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_plane.cpp"
                ,0x2d9,"visplane_t *R_CheckPlane(visplane_t *, int, int)");
}

Assistant:

visplane_t *R_CheckPlane (visplane_t *pl, int start, int stop)
{
	int intrl, intrh;
	int unionl, unionh;
	int x;

	assert (start >= 0 && start < viewwidth);
	assert (stop > start && stop <= viewwidth);

	if (start < pl->left)
	{
		intrl = pl->left;
		unionl = start;
	}
	else
	{
		unionl = pl->left;
		intrl = start;
	}
		
	if (stop > pl->right)
	{
		intrh = pl->right;
		unionh = stop;
	}
	else
	{
		unionh = pl->right;
		intrh = stop;
	}

	for (x = intrl; x < intrh && pl->top[x] == 0x7fff; x++)
		;

	if (x >= intrh)
	{
		// use the same visplane
		pl->left = unionl;
		pl->right = unionh;
	}
	else
	{
		// make a new visplane
		unsigned hash;

		if (pl->portal != NULL && !(pl->portal->mFlags & PORTSF_INSKYBOX) && viewactive)
		{
			hash = MAXVISPLANES;
		}
		else
		{
			hash = visplane_hash (pl->picnum.GetIndex(), pl->lightlevel, pl->height);
		}
		visplane_t *new_pl = new_visplane (hash);

		new_pl->height = pl->height;
		new_pl->picnum = pl->picnum;
		new_pl->lightlevel = pl->lightlevel;
		new_pl->xform = pl->xform;
		new_pl->colormap = pl->colormap;
		new_pl->portal = pl->portal;
		new_pl->extralight = pl->extralight;
		new_pl->visibility = pl->visibility;
		new_pl->viewpos = pl->viewpos;
		new_pl->viewangle = pl->viewangle;
		new_pl->sky = pl->sky;
		new_pl->Alpha = pl->Alpha;
		new_pl->Additive = pl->Additive;
		new_pl->CurrentPortalUniq = pl->CurrentPortalUniq;
		new_pl->MirrorFlags = pl->MirrorFlags;
		new_pl->CurrentSkybox = pl->CurrentSkybox;
		pl = new_pl;
		pl->left = start;
		pl->right = stop;
		clearbufshort (pl->top, viewwidth, 0x7fff);
	}
	return pl;
}